

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::GetSteeringData
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aSteeringData,
          JoinerType aJoinerType)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  writer write;
  string local_c0;
  ErrorCode local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  writer local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  local_70 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_70;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the commissioner is not active";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",&local_68);
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != "");
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_(&local_c0,(v10 *)0x233cbc,(string_view)ZEXT816(0x1e),args_00);
    local_a0 = kInvalidState;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
    __return_storage_ptr__->mCode = local_a0;
  }
  else {
    if (aJoinerType == kNMKP) {
      lVar3 = 0x2b0;
      if (((this->mCommDataset).mPresentFlags & 0x800) != 0) goto LAB_00162235;
      local_68.types_[0] = none_type;
      pcVar5 = "cannot find CCM NMKP Steering Data";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "cannot find CCM NMKP Steering Data";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x22;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      local_78.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        if (pcVar5 == "") break;
        pcVar4 = pcVar5;
        if (*pcVar5 == '{') {
LAB_0016217d:
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_78,pcVar5,pcVar4);
          pcVar5 = fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar4,"",&local_68);
          bVar6 = true;
        }
        else {
          pcVar4 = pcVar5 + 1;
          bVar6 = pcVar4 != "";
          if (bVar6) {
            if (*pcVar4 != '{') {
              pcVar1 = pcVar5 + 2;
              do {
                pcVar4 = pcVar1;
                bVar6 = pcVar4 != "";
                if (pcVar4 == "") goto LAB_00162179;
                pcVar1 = pcVar4 + 1;
              } while (*pcVar4 != '{');
            }
            bVar6 = true;
          }
LAB_00162179:
          if (bVar6) goto LAB_0016217d;
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_78,pcVar5,"");
          bVar6 = false;
        }
      } while (bVar6);
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&local_68;
      fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"cannot find CCM NMKP Steering Data",(string_view)ZEXT816(0x22),
                 args_02);
      local_a0 = kNotFound;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
    }
    else if (aJoinerType == kAE) {
      lVar3 = 0x298;
      if (((this->mCommDataset).mPresentFlags & 0x1000) != 0) goto LAB_00162235;
      local_68.types_[0] = none_type;
      pcVar5 = "cannot find Thread CCM AE Steering Data";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "cannot find Thread CCM AE Steering Data";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x27;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      local_78.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        if (pcVar5 == "") break;
        pcVar4 = pcVar5;
        if (*pcVar5 == '{') {
LAB_00162065:
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_78,pcVar5,pcVar4);
          pcVar5 = fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar4,"",&local_68);
          bVar6 = true;
        }
        else {
          pcVar4 = pcVar5 + 1;
          bVar6 = pcVar4 != "";
          if (bVar6) {
            if (*pcVar4 != '{') {
              pcVar1 = pcVar5 + 2;
              do {
                pcVar4 = pcVar1;
                bVar6 = pcVar4 != "";
                if (pcVar4 == "") goto LAB_00162061;
                pcVar1 = pcVar4 + 1;
              } while (*pcVar4 != '{');
            }
            bVar6 = true;
          }
LAB_00162061:
          if (bVar6) goto LAB_00162065;
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_78,pcVar5,"");
          bVar6 = false;
        }
      } while (bVar6);
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_68;
      fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"cannot find Thread CCM AE Steering Data",
                 (string_view)ZEXT816(0x27),args_01);
      local_a0 = kNotFound;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
    }
    else {
      if (aJoinerType != kMeshCoP) {
        return __return_storage_ptr__;
      }
      lVar3 = 0x280;
      if (((this->mCommDataset).mPresentFlags & 0x2000) != 0) {
LAB_00162235:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (aSteeringData,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(this->super_CommissionerHandler)._vptr_CommissionerHandler + lVar3));
        return __return_storage_ptr__;
      }
      local_68.types_[0] = none_type;
      pcVar5 = "cannot find Thread 1.1 joiner Steering Data";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "cannot find Thread 1.1 joiner Steering Data";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2b;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      local_78.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        if (pcVar5 == "") break;
        pcVar4 = pcVar5;
        if (*pcVar5 == '{') {
LAB_00161e84:
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_78,pcVar5,pcVar4);
          pcVar5 = fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar4,"",&local_68);
          bVar6 = true;
        }
        else {
          pcVar4 = pcVar5 + 1;
          bVar6 = pcVar4 != "";
          if (bVar6) {
            if (*pcVar4 != '{') {
              pcVar1 = pcVar5 + 2;
              do {
                pcVar4 = pcVar1;
                bVar6 = pcVar4 != "";
                if (pcVar4 == "") goto LAB_00161e80;
                pcVar1 = pcVar4 + 1;
              } while (*pcVar4 != '{');
            }
            bVar6 = true;
          }
LAB_00161e80:
          if (bVar6) goto LAB_00161e84;
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_78,pcVar5,"");
          bVar6 = false;
        }
      } while (bVar6);
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_68;
      fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"cannot find Thread 1.1 joiner Steering Data",
                 (string_view)ZEXT816(0x2b),args);
      local_a0 = kNotFound;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
    }
    __return_storage_ptr__->mCode = local_a0;
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_98);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetSteeringData(ByteArray &aSteeringData, JoinerType aJoinerType) const
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    switch (aJoinerType)
    {
    case JoinerType::kMeshCoP:
        VerifyOrExit((mCommDataset.mPresentFlags & CommissionerDataset::kSteeringDataBit),
                     error = ERROR_NOT_FOUND("cannot find Thread 1.1 joiner Steering Data"));
        aSteeringData = mCommDataset.mSteeringData;
        break;

    case JoinerType::kAE:
        VerifyOrExit((mCommDataset.mPresentFlags & CommissionerDataset::kAeSteeringDataBit),
                     error = ERROR_NOT_FOUND("cannot find Thread CCM AE Steering Data"));
        aSteeringData = mCommDataset.mAeSteeringData;
        break;

    case JoinerType::kNMKP:
        VerifyOrExit((mCommDataset.mPresentFlags & CommissionerDataset::kNmkpSteeringDataBit),
                     error = ERROR_NOT_FOUND("cannot find CCM NMKP Steering Data"));
        aSteeringData = mCommDataset.mNmkpSteeringData;
        break;
    }

exit:
    return error;
}